

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_address.cpp
# Opt level: O0

Address * __thiscall
cfd::api::AddressApi::CreateMultisig
          (AddressApi *this,NetType net_type,AddressType address_type,uint32_t req_sig_num,
          vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys,
          Script *redeem_script,Script *witness_script,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list)

{
  undefined8 uVar1;
  int in_ECX;
  NetType_conflict in_EDX;
  Address *in_RDI;
  uint32_t in_R8D;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *in_R9;
  Script *in_stack_00000008;
  Script *in_stack_00000010;
  long in_stack_00000018;
  Script script;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> addr_prefixes;
  Script multisig_script;
  Address *addr;
  char *in_stack_fffffffffffffa28;
  Address *in_stack_fffffffffffffa30;
  allocator *paVar2;
  Address *message;
  undefined4 in_stack_fffffffffffffa4c;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffa50;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_fffffffffffffac8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_fffffffffffffad0;
  Script local_400;
  Address local_3c8;
  Address local_250;
  Script local_d8;
  byte local_9d;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_90;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_78;
  Script local_60;
  int local_18;
  NetType_conflict local_14;
  
  message = in_RDI;
  local_18 = in_ECX;
  local_14 = in_EDX;
  core::ScriptUtil::CreateMultisigRedeemScript(&local_60,in_R8D,in_R9,true);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (&local_78);
  if (in_stack_00000018 == 0) {
    core::GetBitcoinAddressFormatList();
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&local_78,&local_90);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            message);
  }
  else {
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  }
  local_9d = 0;
  core::Address::Address(in_RDI);
  core::Script::Script(&local_d8);
  if (local_18 == 1) {
    core::Address::Address(&local_250,local_14,&local_60,&local_78);
    core::Address::operator=(in_RDI,&local_250);
    core::Address::~Address(in_stack_fffffffffffffa30);
    if (in_stack_00000008 != (Script *)0x0) {
      core::Script::operator=(in_stack_00000008,&local_60);
    }
  }
  else if (local_18 == 3) {
    core::Address::Address(&local_3c8,local_14,kVersion0,&local_60,&local_78);
    core::Address::operator=(in_RDI,&local_3c8);
    core::Address::~Address(in_stack_fffffffffffffa30);
    if (in_stack_00000010 != (Script *)0x0) {
      core::Script::operator=(in_stack_00000010,&local_60);
    }
  }
  else {
    if (local_18 != 5) {
      strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_address.cpp"
              ,0x2f);
      core::logger::warn<cfd::core::AddressType&>
                ((CfdSourceLocation *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                 (AddressType *)0x548a6a);
      error_code = CONCAT13(SUB41((uint)in_stack_fffffffffffffa4c >> 0x18,0),
                            CONCAT12(1,(short)in_stack_fffffffffffffa4c));
      uVar1 = __cxa_allocate_exception(0x30);
      paVar2 = (allocator *)&stack0xfffffffffffffa4f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffa50,
                 "Invalid address_type. address_type must be \"p2sh\" \"p2wsh\" or \"p2sh-p2wsh\".",
                 paVar2);
      core::CfdException::CfdException(in_stack_fffffffffffffa50,error_code,(string *)message);
      __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::ScriptUtil::CreateP2wshLockingScript(&local_400,&local_60);
    core::Script::operator=(&local_d8,&local_400);
    core::Script::~Script((Script *)in_stack_fffffffffffffa30);
    core::Address::Address((Address *)&stack0xfffffffffffffa88,local_14,&local_d8,&local_78);
    core::Address::operator=(in_RDI,(Address *)&stack0xfffffffffffffa88);
    core::Address::~Address(in_stack_fffffffffffffa30);
    if (in_stack_00000008 != (Script *)0x0) {
      core::Script::operator=(in_stack_00000008,&local_d8);
    }
    if (in_stack_00000010 != (Script *)0x0) {
      core::Script::operator=(in_stack_00000010,&local_60);
    }
  }
  local_9d = 1;
  core::Script::~Script((Script *)in_stack_fffffffffffffa30);
  if ((local_9d & 1) == 0) {
    core::Address::~Address(in_stack_fffffffffffffa30);
  }
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             message);
  core::Script::~Script((Script *)in_stack_fffffffffffffa30);
  return message;
}

Assistant:

Address AddressApi::CreateMultisig(
    NetType net_type, AddressType address_type, uint32_t req_sig_num,
    const std::vector<Pubkey>& pubkeys, Script* redeem_script,
    Script* witness_script,
    const std::vector<AddressFormatData>* prefix_list) const {
  // Multisig redeem scriptの作成
  Script multisig_script =
      ScriptUtil::CreateMultisigRedeemScript(req_sig_num, pubkeys);

  std::vector<AddressFormatData> addr_prefixes;
  if (prefix_list == nullptr) {
    addr_prefixes = cfd::core::GetBitcoinAddressFormatList();
  } else {
    addr_prefixes = *prefix_list;
  }

  // Address作成
  Address addr;
  Script script;
  if (address_type == AddressType::kP2shAddress) {
    addr = Address(net_type, multisig_script, addr_prefixes);
    if (redeem_script != nullptr) {
      *redeem_script = multisig_script;
    }
  } else if (address_type == AddressType::kP2wshAddress) {
    // Currently we support only witness version 0.
    addr = Address(
        net_type, WitnessVersion::kVersion0, multisig_script, addr_prefixes);
    if (witness_script != nullptr) {
      *witness_script = multisig_script;
    }
  } else if (address_type == AddressType::kP2shP2wshAddress) {
    script = ScriptUtil::CreateP2wshLockingScript(multisig_script);
    addr = Address(net_type, script, addr_prefixes);
    if (redeem_script != nullptr) {
      *redeem_script = script;
    }
    if (witness_script != nullptr) {
      *witness_script = multisig_script;
    }
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        address_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2sh\" "
        "\"p2wsh\" or \"p2sh-p2wsh\".");  // NOLINT
  }
  return addr;
}